

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colored.cpp
# Opt level: O1

bool __thiscall Colored::setRGB(Colored *this,int color,int *rgb)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  bVar2 = true;
  if (color < 1) {
    if (color == -1) {
      iVar4 = 0xff;
      iVar3 = 0xcc;
      iVar1 = 0x99;
    }
    else {
      if (color != 0) {
        return false;
      }
      iVar1 = 0xff;
      iVar3 = 0xff;
      iVar4 = 0xff;
    }
  }
  else if (color == 1) {
    iVar3 = 0x99;
    iVar1 = 0xff;
    iVar4 = 0x99;
  }
  else if (color == 100) {
    iVar4 = 0xf0;
    iVar3 = 0xfa;
    iVar1 = 0xff;
  }
  else {
    if (color != 0x65) {
      return false;
    }
    iVar1 = 0;
    iVar3 = 0;
    iVar4 = 0;
    bVar2 = false;
  }
  *rgb = iVar1;
  rgb[1] = iVar3;
  rgb[2] = iVar4;
  return bVar2;
}

Assistant:

bool Colored::setRGB(int color, int rgb[]){
    bool flag = true;
    switch (color) {
        case -1:
            rgb[0] = 153;   rgb[1] = 204;   rgb[2] = 255; //blue
            break;
        case 0:
            rgb[0] = 255;   rgb[1] = 255;   rgb[2] = 255; //white
            break;
        case 1:
            rgb[0] = 255;   rgb[1] = 153;   rgb[2] = 153; //red
            break;
        case 100:
            rgb[0] = 255;   rgb[1] = 250;   rgb[2] = 240; //gray
            break;
        case 101:
            rgb[0] = 0;     rgb[1] = 0;     rgb[2] = 0;   //black
        default:
            flag = false;
            break;
    }
    return flag;
}